

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_xpcall(lua_State *L)

{
  int iVar1;
  
  iVar1 = lua_gettop(L);
  luaL_checktype(L,2,6);
  lua_pushboolean(L,1);
  lua_pushvalue(L,1);
  lua_rotate(L,3,2);
  iVar1 = lua_pcallk(L,iVar1 + -2,-1,2,2,finishpcall);
  iVar1 = finishpcall(L,iVar1,2);
  return iVar1;
}

Assistant:

static int luaB_xpcall (lua_State *L) {
  int status;
  int n = lua_gettop(L);
  luaL_checktype(L, 2, LUA_TFUNCTION);  /* check error function */
  lua_pushboolean(L, 1);  /* first result */
  lua_pushvalue(L, 1);  /* function */
  lua_rotate(L, 3, 2);  /* move them below function's arguments */
  status = lua_pcallk(L, n - 2, LUA_MULTRET, 2, 2, finishpcall);
  return finishpcall(L, status, 2);
}